

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TAP_DEVICE(effect_handler_context_t_conflict *context)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  char *buf;
  byte local_51;
  char *cap;
  char *item;
  char *s;
  char *q;
  wchar_t itemmode;
  _Bool used;
  object *obj;
  wchar_t energy;
  wchar_t lev;
  effect_handler_context_t_conflict *context_local;
  
  obj._0_4_ = 0;
  cap = "";
  _energy = context;
  if (context->cmd == (command_conflict *)0x0) {
    _Var1 = get_item((object **)&itemmode,"Drain charges from which item? ",
                     "You have nothing to drain charges from.",CMD_NULL,tval_can_have_charges,
                     L'\x06');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command *)context->cmd,"tgtitem",(object **)&itemmode,
                         "Drain charges from which item? ","You have nothing to drain charges from."
                         ,tval_can_have_charges,L'\x06');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  obj._4_4_ = _itemmode->kind->level;
  _Var1 = tval_is_staff(_itemmode);
  if (_Var1) {
    obj._0_4_ = ((obj._4_4_ + L'\x05') * 3 * (int)_itemmode->pval) / 2;
    cap = "staff";
  }
  else {
    _Var1 = tval_is_wand(_itemmode);
    if (_Var1) {
      obj._0_4_ = ((obj._4_4_ + L'\x05') * 3 * (int)_itemmode->pval) / 2;
      cap = "wand";
    }
  }
  context_local._7_1_ = false;
  if ((int)obj < 0x24) {
    msg("That %s had no useable energy",cap);
  }
  else if (player->csp < player->msp) {
    _itemmode->pval = 0;
    player->upkeep->notice = player->upkeep->notice | 1;
    player->upkeep->redraw = player->upkeep->redraw | 0x20000;
    player->csp = player->csp + (short)((long)(int)obj / 6);
    player->csp_frac = 0;
    if (player->msp < player->csp) {
      player->csp = player->msp;
    }
    msg("You feel your head clear.");
    p = player;
    uVar3 = Rand_div(2);
    local_51 = 1;
    if ((_energy->origin).what == SRC_PLAYER) {
      local_51 = _energy->aware ^ 0xff;
    }
    player_inc_timed(p,L'\t',uVar3 + L'\x01',true,(_Bool)(local_51 & 1),true);
    player->upkeep->redraw = player->upkeep->redraw | 0x80;
    context_local._7_1_ = true;
  }
  else {
    buf = string_make(cap);
    my_strcap(buf);
    msg("Your mana was already at its maximum.  %s not drained.",buf);
    string_free(buf);
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_TAP_DEVICE(effect_handler_context_t *context)
{
	int lev;
	int energy = 0;
	struct object *obj;
	bool used = false;
	int itemmode = (USE_INVEN | USE_FLOOR);
	const char *q, *s;
	const char *item = "";

	/* Get an item */
	q = "Drain charges from which item? ";
	s = "You have nothing to drain charges from.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_can_have_charges, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_can_have_charges, itemmode)) {
		return (used);
	}

	/* Extract the object "level" */
	lev = obj->kind->level;

	/* Extract the object's energy and get its generic name. */
	if (tval_is_staff(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "staff";
	} else if (tval_is_wand(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "wand";
	}

	/* Turn energy into mana. */
	if (energy < 36) {
		/* Require a resonable amount of energy */
		msg("That %s had no useable energy", item);
	} else {
		/* If mana below maximum, increase mana and drain object. */
		if (player->csp < player->msp) {
			/* Drain the object. */
			obj->pval = 0;


			/* Combine / Reorder the pack (later) */
			player->upkeep->notice |= (PN_COMBINE);

			/* Redraw stuff */
			player->upkeep->redraw |= (PR_INVEN);

			/* Increase mana. */
			player->csp += energy / 6;
			player->csp_frac = 0;
			if (player->csp > player->msp) {
				(player->csp = player->msp);
			}

			msg("You feel your head clear.");
			used = true;
			player_inc_timed(player, TMD_STUN, randint1(2), true,
				context->origin.what != SRC_PLAYER
				|| !context->aware, true);

			player->upkeep->redraw |= (PR_MANA);
		} else {
			char *cap = string_make(item);
			my_strcap(cap);
			msg("Your mana was already at its maximum.  %s not drained.", cap);
			string_free(cap);
		}
	}

	return (used);
}